

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::DescriptorBuilder::ValidateFileFeatures
          (DescriptorBuilder *this,FileDescriptor *file,FileDescriptorProto *proto)

{
  bool bVar1;
  Edition edition;
  FeatureSet_FieldPresence FVar2;
  FeatureSet *this_00;
  FileOptions *this_01;
  string_view sVar3;
  FileDescriptorProto *proto_local;
  FileDescriptor *file_local;
  DescriptorBuilder *this_local;
  
  edition = FileDescriptor::edition(file);
  bVar1 = anon_unknown_24::IsLegacyEdition(edition);
  if (!bVar1) {
    this_00 = FileDescriptor::features(file);
    FVar2 = FeatureSet::field_presence(this_00);
    if (FVar2 == FeatureSet_FieldPresence_LEGACY_REQUIRED) {
      sVar3 = FileDescriptor::name(file);
      AddError(this,sVar3,&proto->super_Message,EDITIONS,
               "Required presence can\'t be specified by default.");
    }
    this_01 = FileDescriptor::options(file);
    bVar1 = FileOptions::java_string_check_utf8(this_01);
    if (bVar1) {
      sVar3 = FileDescriptor::name(file);
      AddError(this,sVar3,&proto->super_Message,EDITIONS,
               "File option java_string_check_utf8 is not allowed under editions. Use the (pb.java).utf8_validation feature to control this behavior."
              );
    }
  }
  return;
}

Assistant:

void DescriptorBuilder::ValidateFileFeatures(const FileDescriptor* file,
                                             const FileDescriptorProto& proto) {
  // Rely on our legacy validation for proto2/proto3 files.
  if (IsLegacyEdition(file->edition())) {
    return;
  }

  if (file->features().field_presence() == FeatureSet::LEGACY_REQUIRED) {
    AddError(file->name(), proto, DescriptorPool::ErrorCollector::EDITIONS,
             "Required presence can't be specified by default.");
  }
  if (file->options().java_string_check_utf8()) {
    AddError(
        file->name(), proto, DescriptorPool::ErrorCollector::EDITIONS,
        "File option java_string_check_utf8 is not allowed under editions. Use "
        "the (pb.java).utf8_validation feature to control this behavior.");
  }
}